

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O2

int __thiscall
timertt::details::
thread_impl_template<timertt::details::timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
::shutdown(thread_impl_template<timertt::details::timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
           *this,int __fd,int __how)

{
  int extraout_EAX;
  lock_guard locker;
  unique_lock<std::mutex> uStack_18;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_18,(mutex_type *)this);
  if (((this->
       super_basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::thread>
       ).super_type.m_thread.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0) && (this->m_shutdown == false)) {
    this->m_shutdown = true;
    std::condition_variable::notify_one();
  }
  std::unique_lock<std::mutex>::~unique_lock(&uStack_18);
  return extraout_EAX;
}

Assistant:

void
	shutdown()
	{
		typename base_type::lock_guard locker{ *this };

		if( this->m_thread && !this->m_shutdown )
		{
			this->m_shutdown = true;
			this->notify();
		}
	}